

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URResolution.cpp
# Opt level: O1

void __thiscall
Inferences::URResolution::Item::resolveLiteral
          (Item *this,uint idx,
          QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> *unif,
          Clause *premise,bool useQuerySubstitution)

{
  Color CVar1;
  Literal **ppLVar2;
  ResultSubstitution *pRVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Literal *pLVar7;
  Term *pTVar8;
  Literal *pLVar9;
  AnswerLiteralManager *pAVar10;
  undefined4 extraout_var;
  ulong uVar11;
  Term *pTVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  
  ppLVar2 = (this->_lits)._stack;
  pLVar9 = ppLVar2[idx];
  ppLVar2[idx] = (Literal *)0x0;
  (this->_premises)._array[idx] = premise;
  CVar1 = this->_color;
  if ((~*(uint *)&premise->field_0x38 & 0x300000) == 0) {
    Kernel::Clause::computeColor(premise);
  }
  this->_color = *(uint *)&premise->field_0x38 >> 0x14 & COLOR_INVALID | CVar1;
  if ((&this->_ansLit->super_Term != (Term *)0x0) &&
     (uVar4 = Kernel::Term::numVarOccs(&this->_ansLit->super_Term), uVar4 != 0)) {
    pRVar3 = (unif->unifier)._obj;
    lVar13 = 0x30;
    if (useQuerySubstitution) {
      lVar13 = 0x18;
    }
    pLVar7 = (Literal *)
             (**(code **)((long)pRVar3->_vptr_ResultSubstitution + lVar13))(pRVar3,this->_ansLit);
    this->_ansLit = pLVar7;
  }
  if ((*(int *)(::Lib::env + 0x8898) == 2) &&
     (pLVar7 = Kernel::Clause::getAnswerLiteral(premise), pLVar7 != (Literal *)0x0)) {
    pTVar8 = &Kernel::Clause::getAnswerLiteral(premise)->super_Term;
    uVar4 = Kernel::Term::numVarOccs(pTVar8);
    if (uVar4 != 0) {
      pRVar3 = (unif->unifier)._obj;
      lVar13 = 0x18;
      if (useQuerySubstitution) {
        lVar13 = 0x30;
      }
      pTVar8 = (Term *)(**(code **)((long)pRVar3->_vptr_ResultSubstitution + lVar13))(pRVar3,pTVar8)
      ;
    }
    if (&this->_ansLit->super_Term != (Term *)0x0) {
      if (&this->_ansLit->super_Term == pTVar8) goto LAB_005262bd;
      uVar11 = (pLVar9->super_Term)._args[0]._content;
      pRVar3 = (unif->unifier)._obj;
      lVar13 = 0x30;
      if (useQuerySubstitution) {
        lVar13 = 0x18;
      }
      pLVar9 = (Literal *)
               (**(code **)((long)pRVar3->_vptr_ResultSubstitution + lVar13))(pRVar3,pLVar9);
      if ((uVar11 & 4) == 0) {
        pLVar9 = Kernel::Literal::complementaryLiteral(pLVar9);
      }
      pAVar10 = Shell::AnswerLiteralManager::getInstance();
      pTVar12 = &this->_ansLit->super_Term;
      if ((uVar11 & 4) == 0) {
        pTVar12 = pTVar8;
        pTVar8 = &this->_ansLit->super_Term;
      }
      iVar5 = (*pAVar10->_vptr_AnswerLiteralManager[5])(pAVar10,pLVar9,pTVar8,pTVar12);
      pTVar8 = (Term *)CONCAT44(extraout_var,iVar5);
    }
    this->_ansLit = (Literal *)pTVar8;
  }
LAB_005262bd:
  if (this->_atMostOneNonGround == false) {
    uVar11 = (ulong)((long)(this->_lits)._cursor - (long)(this->_lits)._stack) >> 3;
    if ((int)uVar11 == 0) {
      bVar15 = true;
    }
    else {
      lVar13 = 0x30;
      if (useQuerySubstitution) {
        lVar13 = 0x18;
      }
      uVar14 = 0;
      uVar4 = 0;
      do {
        ppLVar2 = (this->_lits)._stack;
        if (ppLVar2[uVar14] != (Literal *)0x0) {
          pTVar8 = (Term *)(**(code **)((long)((unif->unifier)._obj)->_vptr_ResultSubstitution +
                                       lVar13))();
          ppLVar2[uVar14] = (Literal *)pTVar8;
          uVar6 = Kernel::Term::numVarOccs(pTVar8);
          uVar4 = (uVar4 + 1) - (uint)(uVar6 == 0);
        }
        uVar14 = uVar14 + 1;
      } while ((uVar11 & 0xffffffff) != uVar14);
      bVar15 = uVar4 < 2;
    }
    this->_atMostOneNonGround = bVar15;
  }
  return;
}

Assistant:

void resolveLiteral(unsigned idx, QueryRes<ResultSubstitutionSP, LiteralClause>& unif, Clause* premise, bool useQuerySubstitution)
  {
    Literal* rlit = _lits[idx];
    _lits[idx] = 0;
    _premises[idx] = premise;
    _color = static_cast<Color>(_color | premise->color());
    ASS_NEQ(_color, COLOR_INVALID)

    if (_ansLit && !_ansLit->ground()) {
      _ansLit = unif.unifier->apply(_ansLit, !useQuerySubstitution);
    }
    bool synthesis = (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS);
    if (synthesis && premise->hasAnswerLiteral()) {
      Literal* premAnsLit = premise->getAnswerLiteral();
      if (!premAnsLit->ground()) {
        premAnsLit = unif.unifier->apply(premAnsLit, useQuerySubstitution);
      }
      if (!_ansLit) {
        _ansLit = premAnsLit;
      } else if (_ansLit != premAnsLit) {
        bool neg = rlit->isNegative();
        Literal* resolved = unif.unifier->apply(rlit, !useQuerySubstitution);
        if (neg) {
          resolved = Literal::complementaryLiteral(resolved);
        }
        _ansLit = AnswerLiteralManager::getInstance()->makeITEAnswerLiteral(resolved, neg ? _ansLit : premAnsLit, neg ? premAnsLit : _ansLit);
      }
    }

    if(_atMostOneNonGround) {
      return;
    }

    unsigned nonGroundCnt = 0;
    unsigned clen = _lits.size();
    for(unsigned i=0; i<clen; i++) {
      Literal*& lit = _lits[i];
      if(!lit) {
        continue;
      }
      lit = unif.unifier->apply(lit, !useQuerySubstitution);
      if(!lit->ground()) {
        nonGroundCnt++;
      }
    }
    _atMostOneNonGround = nonGroundCnt<=1;
  }